

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  long lVar1;
  ucvector *puVar2;
  uint in_EAX;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  ulong uVar5;
  uchar *data;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  uchar uVar10;
  ulong local_90;
  uchar *local_58;
  size_t sStack_50;
  undefined8 local_48;
  ucvector *local_38;
  
  sVar8 = 0xffffffffffffffff;
  do {
    lVar1 = sVar8 + 1;
    sVar8 = sVar8 + 1;
  } while (textstring[lVar1] != '\0');
  uVar10 = *keyword;
  if (uVar10 == '\0') {
    return in_EAX;
  }
  uVar9 = 0xffffffffffffffff;
  uVar5 = 0;
  local_90 = 0;
  data = (uchar *)0x0;
  local_38 = out;
  do {
    uVar7 = local_90 + 1;
    puVar4 = data;
    uVar6 = uVar5;
    if (uVar5 < uVar7) {
      uVar6 = uVar7 * 3 >> 1;
      if (uVar5 * 2 < uVar7) {
        uVar6 = uVar7;
      }
      puVar4 = (uchar *)realloc(data,uVar6);
      if (puVar4 != (uchar *)0x0) goto LAB_0011756e;
    }
    else {
LAB_0011756e:
      uVar5 = uVar6;
      puVar4[local_90] = uVar10;
      local_90 = uVar7;
      data = puVar4;
    }
    uVar10 = keyword[uVar9 + 2];
    uVar9 = uVar9 + 1;
  } while (uVar10 != '\0');
  if (0x4e < uVar9) {
    return (uint)puVar4;
  }
  uVar9 = local_90 + 1;
  puVar4 = data;
  uVar7 = uVar5;
  if (uVar5 < uVar9) {
    uVar7 = uVar9 * 3 >> 1;
    if (uVar5 * 2 < uVar9) {
      uVar7 = uVar9;
    }
    puVar4 = (uchar *)realloc(data,uVar7);
    uVar6 = uVar9;
    if (puVar4 != (uchar *)0x0) goto LAB_001175d5;
  }
  else {
LAB_001175d5:
    uVar5 = uVar7;
    puVar4[local_90] = '\0';
    uVar6 = local_90 + 2;
    data = puVar4;
    local_90 = uVar9;
  }
  puVar4 = data;
  uVar9 = uVar5;
  if (uVar5 < uVar6) {
    uVar9 = uVar6 * 3 >> 1;
    if (uVar5 * 2 < uVar6) {
      uVar9 = uVar6;
    }
    puVar4 = (uchar *)realloc(data,uVar9);
    uVar7 = uVar6;
    if (puVar4 != (uchar *)0x0) goto LAB_00117631;
  }
  else {
LAB_00117631:
    uVar5 = uVar9;
    puVar4[uVar6 - 1] = compressed != 0;
    data = puVar4;
    uVar7 = uVar6 + 1;
    local_90 = uVar6;
  }
  puVar4 = data;
  uVar9 = uVar5;
  if (uVar5 < uVar7) {
    uVar9 = uVar7 * 3 >> 1;
    if (uVar5 * 2 < uVar7) {
      uVar9 = uVar7;
    }
    puVar4 = (uchar *)realloc(data,uVar9);
    if (puVar4 != (uchar *)0x0) goto LAB_00117686;
  }
  else {
LAB_00117686:
    uVar5 = uVar9;
    puVar4[uVar7 - 1] = '\0';
    data = puVar4;
    local_90 = uVar7;
  }
  uVar10 = *langtag;
  while (uVar10 != '\0') {
    langtag = (char *)((uchar *)langtag + 1);
    uVar9 = local_90 + 1;
    puVar4 = data;
    uVar7 = uVar5;
    if (uVar5 < uVar9) {
      uVar7 = uVar9 * 3 >> 1;
      if (uVar5 * 2 < uVar9) {
        uVar7 = uVar9;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 != (uchar *)0x0) goto LAB_001176e2;
    }
    else {
LAB_001176e2:
      uVar5 = uVar7;
      puVar4[local_90] = uVar10;
      data = puVar4;
      local_90 = uVar9;
    }
    uVar10 = *langtag;
  }
  uVar9 = local_90 + 1;
  puVar4 = data;
  uVar7 = uVar5;
  if (uVar5 < uVar9) {
    uVar7 = uVar9 * 3 >> 1;
    if (uVar5 * 2 < uVar9) {
      uVar7 = uVar9;
    }
    puVar4 = (uchar *)realloc(data,uVar7);
    if (puVar4 != (uchar *)0x0) goto LAB_00117747;
  }
  else {
LAB_00117747:
    uVar5 = uVar7;
    puVar4[local_90] = '\0';
    data = puVar4;
    local_90 = uVar9;
  }
  uVar10 = *transkey;
  while (uVar10 != '\0') {
    transkey = (char *)((uchar *)transkey + 1);
    uVar9 = local_90 + 1;
    puVar4 = data;
    uVar7 = uVar5;
    if (uVar5 < uVar9) {
      uVar7 = uVar9 * 3 >> 1;
      if (uVar5 * 2 < uVar9) {
        uVar7 = uVar9;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 != (uchar *)0x0) goto LAB_001177a2;
    }
    else {
LAB_001177a2:
      uVar5 = uVar7;
      puVar4[local_90] = uVar10;
      data = puVar4;
      local_90 = uVar9;
    }
    uVar10 = *transkey;
  }
  uVar9 = local_90 + 1;
  puVar4 = data;
  uVar7 = uVar5;
  if (uVar5 < uVar9) {
    uVar7 = uVar9 * 3 >> 1;
    if (uVar5 * 2 < uVar9) {
      uVar7 = uVar9;
    }
    puVar4 = (uchar *)realloc(data,uVar7);
    if (puVar4 != (uchar *)0x0) goto LAB_00117814;
  }
  else {
LAB_00117814:
    uVar5 = uVar7;
    puVar4[local_90] = '\0';
    data = puVar4;
    local_90 = uVar9;
  }
  if (compressed == 0) {
    uVar10 = *textstring;
    while (uVar10 != '\0') {
      textstring = (char *)((uchar *)textstring + 1);
      uVar9 = local_90 + 1;
      puVar4 = data;
      uVar7 = uVar5;
      if (uVar5 < uVar9) {
        uVar7 = uVar9 * 3 >> 1;
        if (uVar5 * 2 < uVar9) {
          uVar7 = uVar9;
        }
        puVar4 = (uchar *)realloc(data,uVar7);
        if (puVar4 != (uchar *)0x0) goto LAB_001178ad;
      }
      else {
LAB_001178ad:
        uVar5 = uVar7;
        puVar4[local_90] = uVar10;
        data = puVar4;
        local_90 = uVar9;
      }
      uVar10 = *textstring;
    }
  }
  else {
    local_58 = (uchar *)0x0;
    sStack_50 = 0;
    local_48 = 0;
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar3 = lodepng_zlib_compress(&local_58,&sStack_50,(uchar *)textstring,sVar8,zlibsettings);
    }
    else {
      uVar3 = (*zlibsettings->custom_zlib)
                        (&local_58,&sStack_50,(uchar *)textstring,sVar8,zlibsettings);
    }
    if ((uVar3 == 0) && (sStack_50 != 0)) {
      sVar8 = 0;
      do {
        uVar10 = local_58[sVar8];
        uVar9 = local_90 + 1;
        puVar4 = data;
        uVar7 = uVar5;
        if (uVar5 < uVar9) {
          uVar7 = uVar9 * 3 >> 1;
          if (uVar5 * 2 < uVar9) {
            uVar7 = uVar9;
          }
          puVar4 = (uchar *)realloc(data,uVar7);
          if (puVar4 != (uchar *)0x0) goto LAB_00117938;
        }
        else {
LAB_00117938:
          uVar5 = uVar7;
          puVar4[local_90] = uVar10;
          data = puVar4;
          local_90 = uVar9;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != sStack_50);
    }
    sStack_50 = 0;
    local_48 = 0;
    free(local_58);
    if (uVar3 != 0) goto LAB_001179a3;
  }
  puVar2 = local_38;
  uVar3 = lodepng_chunk_create(&local_38->data,&local_38->size,(uint)local_90,"iTXt",data);
  if (uVar3 == 0) {
    puVar2->allocsize = puVar2->size;
  }
LAB_001179a3:
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  ucvector data;
  size_t i, textsize = lodepng_strlen(textstring);

  ucvector_init(&data);

  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*null termination char*/
  ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
  ucvector_push_back(&data, 0); /*compression method*/
  for(i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
  ucvector_push_back(&data, 0); /*null termination char*/
  for(i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
  ucvector_push_back(&data, 0); /*null termination char*/

  if(compressed) {
    ucvector compressed_data;
    ucvector_init(&compressed_data);
    error = zlib_compress(&compressed_data.data, &compressed_data.size,
                          (const unsigned char*)textstring, textsize, zlibsettings);
    if(!error) {
      for(i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
    }
    ucvector_cleanup(&compressed_data);
  } else /*not compressed*/ {
    for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
  }

  if(!error) error = addChunk(out, "iTXt", data.data, data.size);
  ucvector_cleanup(&data);
  return error;
}